

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

GraphParts * __thiscall
QGraphicsAnchorLayoutPrivate::getGraphParts
          (GraphParts *__return_storage_ptr__,QGraphicsAnchorLayoutPrivate *this,
          Orientation orientation)

{
  Data *first;
  AnchorVertex *second;
  QSimplexConstraint **b;
  bool bVar1;
  AnchorData *pAVar2;
  AnchorData *pAVar3;
  QList<QSimplexConstraint_*> *this_00;
  iterator abegin;
  iterator iVar4;
  long lVar5;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  iterator iVar6;
  long lVar7;
  long in_FS_OFFSET;
  QList<QSimplexConstraint_*> n;
  QHash<QSimplexVariable_*,_QHashDummyValue> local_68;
  QArrayDataPointer<QSimplexConstraint_*> local_60;
  GraphParts *local_48;
  QHash<QSimplexVariable_*,_QHashDummyValue> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->nonTrunkConstraints).d.ptr = (QSimplexConstraint **)0x0;
  (__return_storage_ptr__->nonTrunkConstraints).d.size = 0;
  (__return_storage_ptr__->trunkConstraints).d.size = 0;
  (__return_storage_ptr__->nonTrunkConstraints).d.d = (Data *)0x0;
  (__return_storage_ptr__->trunkConstraints).d.d = (Data *)0x0;
  (__return_storage_ptr__->trunkConstraints).d.ptr = (QSimplexConstraint **)0x0;
  lVar5 = (long)(int)orientation;
  this_01 = (this->graph).m_data + lVar5 + -1;
  first = (this->graph).m_data[lVar5 + 1].m_graph.d;
  second = (this->layoutFirstVertex).m_data[lVar5 + 1];
  if (second == (AnchorVertex *)0x0) {
    pAVar2 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(AnchorVertex *)first,(this->layoutCentralVertex).m_data[lVar5 + 1]);
    pAVar3 = (AnchorData *)0x0;
  }
  else {
    pAVar2 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(AnchorVertex *)first,second);
    pAVar3 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(this->layoutFirstVertex).m_data[lVar5 + 1],
                      (this->layoutCentralVertex).m_data[lVar5 + 1]);
  }
  this_00 = &__return_storage_ptr__->nonTrunkConstraints;
  local_60.d = (this->constraints).m_data[lVar5 + -1].d.d;
  local_60.ptr = (this->constraints).m_data[lVar5 + -1].d.ptr;
  local_60.size = (this->constraints).m_data[lVar5 + -1].d.size;
  if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_60.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  b = (this->constraints).m_data[lVar5 + 1].d.ptr;
  QtPrivate::QCommonArrayOps<QSimplexConstraint_*>::growAppend
            ((QCommonArrayOps<QSimplexConstraint_*> *)&local_60,b,
             b + (this->constraints).m_data[lVar5 + 1].d.size);
  QArrayDataPointer<QSimplexConstraint_*>::operator=(&this_00->d,&local_60);
  if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d)->super_QArrayData,8,0x10);
    }
  }
  local_68.d = (Data *)0x0;
  local_60.d = (Data *)&pAVar2->super_QSimplexVariable;
  if (pAVar2 == (AnchorData *)0x0) {
    local_60.d = (Data *)0x0;
  }
  QHash<QSimplexVariable*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QSimplexVariable*,QHashDummyValue> *)&local_68,(QSimplexVariable **)&local_60,
             (QHashDummyValue *)&local_48);
  if (pAVar3 != (AnchorData *)0x0) {
    local_60.d = (Data *)&pAVar3->super_QSimplexVariable;
    QHash<QSimplexVariable*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QSimplexVariable*,QHashDummyValue> *)&local_68,(QSimplexVariable **)&local_60,
               (QHashDummyValue *)&local_48);
  }
  abegin = QList<QSimplexConstraint_*>::end(this_00);
  do {
    iVar4 = QList<QSimplexConstraint_*>::begin(this_00);
    local_60.ptr = (QSimplexConstraint **)&local_68;
    lVar5 = (long)abegin.i - (long)iVar4.i;
    local_60.d = (Data *)__return_storage_ptr__;
    local_48 = __return_storage_ptr__;
    local_40 = (QHash<QSimplexVariable_*,_QHashDummyValue> *)local_60.ptr;
    if (0 < lVar5 >> 5) {
      lVar7 = (lVar5 >> 5) + 1;
      iVar6 = iVar4;
      do {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_60,iVar6);
        iVar4.i = iVar6.i;
        if (bVar1) goto LAB_005c160f;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_60,(iterator)(iVar6.i + 1));
        iVar4.i = iVar6.i + 1;
        if (bVar1) goto LAB_005c160f;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_60,(iterator)(iVar6.i + 2));
        iVar4.i = iVar6.i + 2;
        if (bVar1) goto LAB_005c160f;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_60,(iterator)(iVar6.i + 3));
        iVar4.i = iVar6.i + 3;
        if (bVar1) goto LAB_005c160f;
        iVar4.i = iVar6.i + 4;
        lVar7 = lVar7 + -1;
        lVar5 = lVar5 + -0x20;
        iVar6.i = iVar4.i;
      } while (1 < lVar7);
    }
    lVar5 = lVar5 >> 3;
    if (lVar5 == 1) {
LAB_005c15fb:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
              operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                          *)&local_60,iVar4);
      if (!bVar1) {
        iVar4.i = abegin.i;
      }
    }
    else if (lVar5 == 2) {
LAB_005c15e3:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
              operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                          *)&local_60,iVar4);
      if (!bVar1) {
        iVar4.i = iVar4.i + 1;
        goto LAB_005c15fb;
      }
    }
    else {
      if (lVar5 != 3) break;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
              operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                          *)&local_60,iVar4);
      if (!bVar1) {
        iVar4.i = iVar4.i + 1;
        goto LAB_005c15e3;
      }
    }
LAB_005c160f:
    iVar6.i = iVar4.i + 1;
    if (iVar6.i != abegin.i && iVar4.i != abegin.i) {
      do {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_48,iVar6);
        if (!bVar1) {
          *iVar4.i = *iVar6.i;
          iVar4.i = iVar4.i + 1;
        }
        iVar6.i = iVar6.i + 1;
      } while (iVar6.i != abegin.i);
    }
    bVar1 = iVar4.i != abegin.i;
    abegin.i = iVar4.i;
  } while (bVar1);
  iVar4 = QList<QSimplexConstraint_*>::end(this_00);
  QList<QSimplexConstraint_*>::erase(this_00,(const_iterator)abegin.i,(const_iterator)iVar4.i);
  QHash<QSimplexVariable_*,_QHashDummyValue>::~QHash(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QGraphicsAnchorLayoutPrivate::GraphParts
QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation orientation)
{
    GraphParts result;

    Q_ASSERT(layoutFirstVertex[orientation] && layoutLastVertex[orientation]);

    AnchorData *edgeL1 = nullptr;
    AnchorData *edgeL2 = nullptr;

    // The layout may have a single anchor between Left and Right or two half anchors
    // passing through the center
    if (layoutCentralVertex[orientation]) {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutCentralVertex[orientation]);
        edgeL2 = graph[orientation].edgeData(layoutCentralVertex[orientation], layoutLastVertex[orientation]);
    } else {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutLastVertex[orientation]);
    }

    result.nonTrunkConstraints = constraints[orientation] + itemCenterConstraints[orientation];

    QSet<QSimplexVariable *> trunkVariables;

    trunkVariables += edgeL1;
    if (edgeL2)
        trunkVariables += edgeL2;

    bool dirty;
    auto end = result.nonTrunkConstraints.end();
    do {
        dirty = false;

        auto isMatch = [&result, &trunkVariables](QSimplexConstraint *c) -> bool {
            bool match = false;

            // Check if this constraint have some overlap with current
            // trunk variables...
            for (QSimplexVariable *ad : std::as_const(trunkVariables)) {
                if (c->variables.contains(ad)) {
                    match = true;
                    break;
                }
            }

            // If so, we add it to trunk, and erase it from the
            // remaining constraints.
            if (match) {
                result.trunkConstraints += c;
                for (auto jt = c->variables.cbegin(), end = c->variables.cend(); jt != end; ++jt)
                    trunkVariables.insert(jt.key());
                return true;
            } else {
                // Note that we don't erase the constraint if it's not
                // a match, since in a next iteration of a do-while we
                // can pass on it again and it will be a match.
                //
                // For example: if trunk share a variable with
                // remainingConstraints[1] and it shares with
                // remainingConstraints[0], we need a second iteration
                // of the do-while loop to match both.
                return false;
            }
        };
        const auto newEnd = std::remove_if(result.nonTrunkConstraints.begin(), end, isMatch);
        dirty = newEnd != end;
        end = newEnd;
    } while (dirty);

    result.nonTrunkConstraints.erase(end, result.nonTrunkConstraints.end());

    return result;
}